

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int rfftb1_(int *n,int *in,double *c__,double *ch,double *wa,double *fac)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int l1;
  int ido;
  double *local_80;
  int *local_78;
  double *local_70;
  int local_64;
  double *local_60;
  double *local_58;
  int idl1;
  double *local_48;
  int *local_40;
  ulong local_38;
  
  iVar8 = *in;
  uVar4 = (ulong)iVar8;
  uVar2 = (uint)fac[1];
  uVar6 = ~uVar4;
  local_38 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    iVar13 = 0;
  }
  else {
    uVar10 = 0;
    iVar13 = 0;
    do {
      iVar12 = 1 - iVar13;
      if ((int)fac[uVar10 + 2] < 6) {
        iVar13 = iVar12;
      }
      if (local_38 - 1 == uVar10) {
        iVar13 = iVar12;
      }
      uVar10 = uVar10 + 1;
    } while (local_38 != uVar10);
  }
  uVar1 = *n;
  uVar9 = (uVar1 | 0xfffffffe) + uVar1;
  if (iVar13 == 0) {
    if (1 < (int)uVar9) {
      pdVar7 = c__ + uVar6 + 1;
      uVar6 = 2;
      do {
        pdVar7[uVar4 * 2] = pdVar7[uVar4 * 2] * 0.5;
        pdVar7[uVar4 * 3] = pdVar7[uVar4 * 3] * -0.5;
        pdVar7 = pdVar7 + uVar4 * 2;
        uVar6 = uVar6 + 2;
      } while (uVar6 <= uVar9);
    }
  }
  else {
    *ch = *c__;
    ch[(long)(int)uVar1 + -1] = c__[uVar6 + (long)(int)(uVar1 * iVar8) + 1];
    if (1 < (int)uVar9) {
      pdVar7 = c__ + uVar6 + 1;
      uVar6 = 2;
      do {
        ch[uVar6 - 1] = pdVar7[uVar4 * 2] * 0.5;
        pdVar11 = pdVar7 + uVar4 * 3;
        pdVar7 = pdVar7 + uVar4 * 2;
        ch[uVar6] = *pdVar11 * -0.5;
        uVar6 = uVar6 + 2;
      } while (uVar6 <= uVar9);
    }
  }
  l1 = 1;
  if (0 < (int)uVar2) {
    local_60 = wa + -1;
    iVar8 = 1;
    uVar4 = 0;
    local_80 = ch;
    local_78 = in;
    local_70 = c__;
    local_58 = fac;
    local_40 = n;
    do {
      iVar15 = (int)local_58[uVar4 + 2];
      iVar14 = l1 * iVar15;
      iVar12 = *local_40 / iVar14;
      idl1 = l1 * iVar12;
      ido = iVar12;
      local_64 = iVar15;
      switch(iVar15) {
      case 2:
        if (iVar13 == 0) {
          piVar16 = &c__1;
          piVar5 = local_78;
          pdVar7 = local_70;
          pdVar11 = local_80;
        }
        else {
          piVar5 = &c__1;
          pdVar7 = local_80;
          pdVar11 = local_70;
          piVar16 = local_78;
        }
        r1f2kb_(&ido,&l1,pdVar7,piVar5,pdVar11,piVar16,local_60 + iVar8);
        break;
      case 3:
        if (iVar13 == 0) {
          piVar16 = &c__1;
          piVar5 = local_78;
          pdVar7 = local_70;
          pdVar11 = local_80;
        }
        else {
          piVar5 = &c__1;
          pdVar7 = local_80;
          pdVar11 = local_70;
          piVar16 = local_78;
        }
        r1f3kb_(&ido,&l1,pdVar7,piVar5,pdVar11,piVar16,local_60 + iVar8,local_60 + (iVar8 + iVar12))
        ;
        break;
      case 4:
        if (iVar13 == 0) {
          piVar16 = &c__1;
          piVar5 = local_78;
          pdVar7 = local_70;
          pdVar11 = local_80;
        }
        else {
          piVar5 = &c__1;
          pdVar7 = local_80;
          pdVar11 = local_70;
          piVar16 = local_78;
        }
        r1f4kb_(&ido,&l1,pdVar7,piVar5,pdVar11,piVar16,local_60 + iVar8,local_60 + (iVar8 + iVar12),
                local_60 + (iVar8 + iVar12 + iVar12));
        break;
      case 5:
        iVar3 = iVar8 + iVar12 + iVar12;
        local_48 = local_60 + iVar8;
        if (iVar13 == 0) {
          piVar16 = &c__1;
          piVar5 = local_78;
          pdVar7 = local_70;
          pdVar11 = local_80;
        }
        else {
          piVar5 = &c__1;
          pdVar7 = local_80;
          pdVar11 = local_70;
          piVar16 = local_78;
        }
        r1f5kb_(&ido,&l1,pdVar7,piVar5,pdVar11,piVar16,local_48,local_60 + (iVar8 + iVar12),
                local_60 + iVar3,local_60 + (iVar3 + iVar12));
        break;
      default:
        if (iVar13 == 0) {
          piVar16 = &c__1;
          pdVar7 = local_70;
          piVar5 = local_78;
          pdVar11 = local_80;
        }
        else {
          pdVar7 = local_80;
          piVar5 = &c__1;
          pdVar11 = local_70;
          piVar16 = local_78;
        }
        r1fgkb_(&ido,&local_64,&l1,&idl1,pdVar7,pdVar7,pdVar7,piVar5,pdVar11,pdVar11,piVar16,
                local_60 + iVar8);
        if (iVar12 == 1) {
          iVar13 = 1 - iVar13;
        }
        goto LAB_0013711f;
      }
      iVar13 = 1 - iVar13;
LAB_0013711f:
      iVar8 = iVar8 + iVar12 * (iVar15 + -1);
      uVar4 = uVar4 + 1;
      l1 = iVar14;
    } while (local_38 != uVar4);
  }
  return 0;
}

Assistant:

int rfftb1_(int *n, int *in, fft_real_t *c__, fft_real_t *ch,
	fft_real_t *wa, fft_real_t *fac)
{
    /* System generated locals */
    int c_dim1, c_offset, i__1;

    /* Local variables */
     int j, k1, l1, l2, na, nf, ip, nl, iw, ix2, ix3, ix4, ido,
	    idl1;
     fft_real_t half;
     int modn;
     fft_real_t halfm;
    extern /* Subroutine */ int r1f2kb_(int *, int *, fft_real_t *, int
	    *, fft_real_t *, int *, fft_real_t *), r1f4kb_(int *, int *, fft_real_t
	    *, int *, fft_real_t *, int *, fft_real_t *, fft_real_t *, fft_real_t *), r1f3kb_(
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , fft_real_t *), r1f5kb_(int *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, fft_real_t *, fft_real_t *, fft_real_t *, fft_real_t *), r1fgkb_(int *,
	    int *, int *, int *, fft_real_t *, fft_real_t *, fft_real_t *, int *
	    , fft_real_t *, fft_real_t *, int *, fft_real_t *);


    /* Parameter adjustments */
    --wa;
    c_dim1 = *in;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;
    --ch;
    --fac;

    /* Function Body */
    nf = fac[2];
    na = 0;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	na = 1 - na;
	if (ip <= 5) {
	    goto L10;
	}
	if (k1 == nf) {
	    goto L10;
	}
	na = 1 - na;
L10:
	;
    }
    half = .5;
    halfm = -.5;
    modn = *n % 2;
    nl = *n - 2;
    if (modn != 0) {
	nl = *n - 1;
    }
    if (na == 0) {
	goto L120;
    }
    ch[1] = c__[c_dim1 + 1];
    ch[*n] = c__[*n * c_dim1 + 1];
    i__1 = nl;
    for (j = 2; j <= i__1; j += 2) {
	ch[j] = half * c__[j * c_dim1 + 1];
	ch[j + 1] = halfm * c__[(j + 1) * c_dim1 + 1];
/* L118: */
    }
    goto L124;
L120:
    i__1 = nl;
    for (j = 2; j <= i__1; j += 2) {
	c__[j * c_dim1 + 1] = half * c__[j * c_dim1 + 1];
	c__[(j + 1) * c_dim1 + 1] = halfm * c__[(j + 1) * c_dim1 + 1];
/* L122: */
    }
L124:
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	l2 = ip * l1;
	ido = *n / l2;
	idl1 = ido * l1;
	if (ip != 4) {
	    goto L103;
	}
	ix2 = iw + ido;
	ix3 = ix2 + ido;
	if (na != 0) {
	    goto L101;
	}
	r1f4kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2], &wa[ix3]);
	goto L102;
L101:
	r1f4kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2], &wa[ix3]);
L102:
	na = 1 - na;
	goto L115;
L103:
	if (ip != 2) {
	    goto L106;
	}
	if (na != 0) {
	    goto L104;
	}
	r1f2kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw]);
	goto L105;
L104:
	r1f2kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw]);
L105:
	na = 1 - na;
	goto L115;
L106:
	if (ip != 3) {
	    goto L109;
	}
	ix2 = iw + ido;
	if (na != 0) {
	    goto L107;
	}
	r1f3kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2]);
	goto L108;
L107:
	r1f3kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2]);
L108:
	na = 1 - na;
	goto L115;
L109:
	if (ip != 5) {
	    goto L112;
	}
	ix2 = iw + ido;
	ix3 = ix2 + ido;
	ix4 = ix3 + ido;
	if (na != 0) {
	    goto L110;
	}
	r1f5kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2], &wa[ix3], &wa[ix4]);
	goto L111;
L110:
	r1f5kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2], &wa[ix3], &wa[ix4]);
L111:
	na = 1 - na;
	goto L115;
L112:
	if (na != 0) {
	    goto L113;
	}
	r1fgkb_(&ido, &ip, &l1, &idl1, &c__[c_offset], &c__[c_offset], &c__[
		c_offset], in, &ch[1], &ch[1], &c__1, &wa[iw]);
	goto L114;
L113:
	r1fgkb_(&ido, &ip, &l1, &idl1, &ch[1], &ch[1], &ch[1], &c__1, &c__[
		c_offset], &c__[c_offset], in, &wa[iw]);
L114:
	if (ido == 1) {
	    na = 1 - na;
	}
L115:
	l1 = l2;
	iw += (ip - 1) * ido;
/* L116: */
    }
    return 0;
}